

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

boolean donning_on(obj *otmp)

{
  code *pcVar1;
  
  if (uarm == otmp) {
    pcVar1 = Armor_on;
  }
  else if (uarmu == otmp) {
    pcVar1 = Shirt_on;
  }
  else if (uarmc == otmp) {
    pcVar1 = Cloak_on;
  }
  else if (uarmf == otmp) {
    pcVar1 = Boots_on;
  }
  else if (uarmh == otmp) {
    pcVar1 = Helmet_on;
  }
  else if (uarmg == otmp) {
    pcVar1 = Gloves_on;
  }
  else {
    if (uarms != otmp) {
      return '\0';
    }
    pcVar1 = Shield_on;
  }
  return afternmv == pcVar1;
}

Assistant:

boolean donning_on(const struct obj *otmp)
{
	/*
	 * Caveat: This returns FALSE if armor that was being put on is
	 *         cancelled with cancel_don() but has not yet been dealt
	 *         with by the corresponding Foo_off().
	 *
	 * cancel_don() unsets afternmv, but the matching uarm* global isn't
	 * unset until its corresponding Foo_off() is called.
	 */
	if (otmp == uarm) return (afternmv == Armor_on);
	if (otmp == uarmu) return (afternmv == Shirt_on);
	if (otmp == uarmc) return (afternmv == Cloak_on);
	if (otmp == uarmf) return (afternmv == Boots_on);
	if (otmp == uarmh) return (afternmv == Helmet_on);
	if (otmp == uarmg) return (afternmv == Gloves_on);
	if (otmp == uarms) return (afternmv == Shield_on);
	return FALSE;
}